

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disasm.c
# Opt level: O1

void bitaddr_memonic(int aValue,char *aBuffer)

{
  uint uVar1;
  char regname [16];
  undefined4 local_28;
  undefined1 local_24;
  
  if (aValue < 0x80) {
    uVar1 = aValue >> 3;
LAB_0010455d:
    sprintf((char *)&local_28,"%02Xh",(ulong)uVar1);
  }
  else {
    uVar1 = aValue & 0xf8;
    switch(uVar1 - 0x80 >> 3) {
    case 0:
      local_28 = (uint)local_28._3_1_ << 0x18;
      local_28 = CONCAT22(local_28._2_2_,0x3050);
      break;
    case 1:
      local_24 = 0;
      local_28 = 0x4e4f4354;
      break;
    case 2:
      local_28 = (uint)local_28._3_1_ << 0x18;
      local_28 = CONCAT22(local_28._2_2_,0x3150);
      break;
    case 3:
      local_24 = 0;
      local_28 = 0x4e4f4353;
      break;
    case 4:
      local_28 = (uint)local_28._3_1_ << 0x18;
      local_28 = CONCAT22(local_28._2_2_,0x3250);
      break;
    case 5:
      local_28 = (uint)local_28._3_1_ << 0x18;
      local_28 = CONCAT22(local_28._2_2_,0x4549);
      break;
    case 6:
      local_28 = (uint)local_28._3_1_ << 0x18;
      local_28 = CONCAT22(local_28._2_2_,0x3350);
      break;
    case 7:
      local_28 = (uint)local_28._3_1_ << 0x18;
      local_28 = CONCAT22(local_28._2_2_,0x5049);
      break;
    default:
      goto LAB_0010455d;
    case 10:
      local_28 = 0x575350;
      break;
    case 0xc:
      local_28 = 0x434341;
      break;
    case 0xe:
      local_28 = CONCAT22(local_28._2_2_,0x42);
    }
  }
  sprintf(aBuffer,"%s.%d",&local_28,(ulong)(aValue & 7));
  return;
}

Assistant:

void bitaddr_memonic(int aValue, char *aBuffer)
{
    char regname[16];

    if (aValue > 0x7f)
    {
        switch ((aValue & 0xf8) - 0x80)
        {
        case REG_ACC:
            strcpy(regname, "ACC"); 
            break;
        case REG_B:
            strcpy(regname, "B");
            break;
        case REG_PSW:
            strcpy(regname, "PSW");
            break;
        case REG_SP:
            strcpy(regname, "SP");
            break;
        case REG_DPL:
            strcpy(regname, "DPL");
            break;
        case REG_DPH:
            strcpy(regname, "DPH");
            break;
        case REG_P0:
            strcpy(regname, "P0");
            break;
        case REG_P1:
            strcpy(regname, "P1");
            break;
        case REG_P2:
            strcpy(regname, "P2");
            break;
        case REG_P3:
            strcpy(regname, "P3");
            break;
        case REG_IP:
            strcpy(regname, "IP");
            break;
        case REG_IE:
            strcpy(regname, "IE");
            break;
        case REG_TMOD:
            strcpy(regname, "TMOD");
            break;
        case REG_TCON:
            strcpy(regname, "TCON");
            break;
        case REG_TH0:
            strcpy(regname, "TH0");
            break;
        case REG_TL0:
            strcpy(regname, "TL0");
            break;
        case REG_TH1:
            strcpy(regname, "TH1");
            break;
        case REG_TL1:
            strcpy(regname, "TL1");
            break;
        case REG_SCON:
            strcpy(regname, "SCON");
            break;
        case REG_PCON:
            strcpy(regname, "PCON");
            break;
        default:
            sprintf(regname, "%02Xh",(aValue & 0xF8));
            break;
        }
    }
    else
    {
        sprintf(regname, "%02Xh", aValue >> 3);
    }

    sprintf(aBuffer, "%s.%d", regname, aValue & 7);
}